

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType::~IfcMechanicalFastenerType
          (IfcMechanicalFastenerType *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x38 = 0x88e678;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x20 = 0x88e740;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0xc0 = 0x88e6a0;
  this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
  super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e6c8;
  this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
  super_IfcTypeProduct.Tag.ptr._M_string_length = 0x88e6f0;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.field_0x180 =
       0x88e718;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
             field_0x190;
  puVar1 = &this[-1].super_IfcFastenerType.super_IfcElementComponentType.field_0x1a0;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x38 = 0x88e768;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x20 = 0x88e808;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0xc0 = 0x88e790;
  this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
  super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e7b8;
  this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
  super_IfcTypeProduct.Tag.ptr._M_string_length = 0x88e7e0;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
             super_IfcTypeProduct.field_0x158;
  puVar1 = &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
            field_0x168;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
            super_IfcTypeProduct.super_IfcTypeObject.field_0x38;
  pvVar3 = *(void **)((long)&this[-1].super_IfcFastenerType.super_IfcElementComponentType.
                             super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this[-1].super_IfcFastenerType.super_IfcElementComponentType.
                                     super_IfcElementType.super_IfcTypeProduct.field_0x148 -
                           (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)puVar1,&PTR_construction_vtable_24__0088e250);
  operator_delete(puVar1,0x1c8);
  return;
}

Assistant:

IfcMechanicalFastenerType() : Object("IfcMechanicalFastenerType") {}